

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O0

bool __thiscall SDIOAnalyzer::FrameStateMachine(SDIOAnalyzer *this)

{
  bool bVar1;
  U8 UVar2;
  ulong uVar3;
  U64 UVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  U32 UVar8;
  uint uVar9;
  MarkerType MVar10;
  unsigned_long_long *puVar11;
  pointer pFVar12;
  pointer pSVar13;
  type pFVar14;
  FrameV2 *this_00;
  int local_58;
  int local_54;
  int i_2;
  int i_1;
  int i;
  byte local_3a;
  bool local_39;
  U8 respLength;
  U64 UStack_38;
  bool done;
  Frame frame;
  SDIOAnalyzer *this_local;
  
  Frame::Frame((Frame *)&stack0xffffffffffffffc8);
  local_39 = false;
  switch(this->frameState) {
  case 0:
    UStack_38 = this->lastFallingClockEdge;
    _frame = AnalyzerChannelData::GetSampleOfNextEdge();
    AnalyzerChannelData::GetBitState();
    pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
              operator->(&this->mResults);
    AnalyzerResults::AddFrame((Frame *)pSVar13);
    pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
    FrameV2::AddBoolean((char *)pFVar12,true);
    this->startingSampleInclusive = UStack_38;
    iVar7 = AnalyzerChannelData::GetBitState();
    this->isCmd = iVar7 != 0;
    pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
              operator->(&this->mResults);
    UVar4 = this->lastFallingClockEdge;
    std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
              (&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)pSVar13,(MarkerType)UVar4,(Channel *)0x8);
    if ((this->isCmd & 1U) == 0) {
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      MVar10 = AnalyzerChannelData::GetSampleNumber();
      std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
                (&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar13,MVar10,(Channel *)0xb);
    }
    else {
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      MVar10 = AnalyzerChannelData::GetSampleNumber();
      std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
                (&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar13,MVar10,(Channel *)0xa);
    }
    this->frameState = 1;
    this->frameCounter = 6;
    this->qwordLow = 0;
    this->lastCommand = 0;
    this->expectedCRC = 0;
    this->startOfNextFrame = 0xffffffffffffffff;
    break;
  case 1:
    puVar11 = std::min<unsigned_long_long>(&this->startOfNextFrame,&this->lastFallingClockEdge);
    this->startOfNextFrame = *puVar11;
    UVar4 = this->qwordLow;
    uVar9 = AnalyzerChannelData::GetBitState();
    this->qwordLow = UVar4 * 2 | (ulong)uVar9;
    this->frameCounter = this->frameCounter - 1;
    if (this->frameCounter == 0) {
      UStack_38 = this->startOfNextFrame;
      _frame = AnalyzerChannelData::GetSampleOfNextEdge();
      uVar9 = (uint)this->qwordLow & 0x3f;
      bVar1 = this->isCmd;
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)pSVar13);
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      UVar4 = this->startOfNextFrame;
      std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
                (&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar13,(int)UVar4 + ErrorDot,(Channel *)0x0);
      pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
      FrameV2::AddByte((char *)pFVar12,'+');
      pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
      FrameV2::AddBoolean((char *)pFVar12,true);
      UVar8 = sdCRC7(0,(bVar1 & 1U) << 6 | (byte)uVar9);
      this->expectedCRC = UVar8;
      this->lastCommand = uVar9;
      if (((this->isCmd & 1U) == 0) &&
         (((this->qwordLow == 2 || (this->qwordLow == 9)) || (this->qwordLow == 10)))) {
        local_3a = 0x7f;
        this->frameState = 3;
      }
      else {
        local_3a = 0x20;
        this->frameState = 2;
      }
      this->byte = '\0';
      this->qwordLow = 0;
      this->byteCounter = 0;
      this->frameCounter = (uint)local_3a;
      this->startOfNextFrame = 0xffffffffffffffff;
    }
    break;
  case 2:
    puVar11 = std::min<unsigned_long_long>(&this->startOfNextFrame,&this->lastFallingClockEdge);
    this->startOfNextFrame = *puVar11;
    UVar2 = this->byte;
    bVar6 = AnalyzerChannelData::GetBitState();
    this->byte = UVar2 * '\x02' | bVar6;
    UVar4 = this->qwordLow;
    uVar9 = AnalyzerChannelData::GetBitState();
    this->qwordLow = UVar4 * 2 | (ulong)uVar9;
    this->frameCounter = this->frameCounter - 1;
    if ((this->frameCounter & 7) == 0) {
      this->data[this->byteCounter] = this->byte;
      this->byteCounter = this->byteCounter + 1;
      this->byte = '\0';
    }
    if (this->frameCounter == 0) {
      UStack_38 = this->startOfNextFrame;
      _frame = AnalyzerChannelData::GetSampleOfNextEdge();
      uVar5 = this->qwordLow;
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)pSVar13);
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      UVar4 = this->startOfNextFrame;
      std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
                (&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar13,(int)UVar4 + ErrorDot,(Channel *)0x2);
      pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
      FrameV2::AddByteArray((char *)pFVar12,(uchar *)"ARG",(ulonglong)this->data);
      for (i_2 = 0x18; -1 < i_2; i_2 = i_2 + -8) {
        UVar8 = sdCRC7(this->expectedCRC,(U8)(uVar5 >> ((byte)i_2 & 0x3f)));
        this->expectedCRC = UVar8;
      }
      this->frameState = 4;
      this->frameCounter = 7;
      this->qwordLow = 0;
      this->startOfNextFrame = 0xffffffffffffffff;
    }
    break;
  case 3:
    puVar11 = std::min<unsigned_long_long>(&this->startOfNextFrame,&this->lastFallingClockEdge);
    this->startOfNextFrame = *puVar11;
    UVar2 = this->byte;
    bVar6 = AnalyzerChannelData::GetBitState();
    this->byte = UVar2 * '\x02' | bVar6;
    UVar4 = this->qwordLow;
    uVar9 = AnalyzerChannelData::GetBitState();
    this->qwordLow = UVar4 * 2 | (ulong)uVar9;
    this->frameCounter = this->frameCounter - 1;
    if ((this->frameCounter & 7) == 0) {
      this->data[this->byteCounter] = this->byte;
    }
    if (this->frameCounter == 0x3f) {
      this->qwordHigh = this->qwordLow;
      this->qwordLow = 0;
    }
    if (this->frameCounter == 0) {
      UStack_38 = this->startOfNextFrame;
      _frame = AnalyzerChannelData::GetSampleOfNextEdge();
      uVar5 = this->qwordHigh;
      uVar3 = this->qwordLow;
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)pSVar13);
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      UVar4 = this->startOfNextFrame;
      std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
                (&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)pSVar13,(int)UVar4 + ErrorDot,(Channel *)0x2);
      pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
      FrameV2::AddByteArray((char *)pFVar12,(uchar *)"ARG",(ulonglong)this->data);
      for (local_54 = 0x18; -1 < local_54; local_54 = local_54 + -8) {
        UVar8 = sdCRC7(this->expectedCRC,(U8)(uVar5 >> ((byte)local_54 & 0x3f)));
        this->expectedCRC = UVar8;
      }
      for (local_58 = 0x18; -1 < local_58; local_58 = local_58 + -8) {
        UVar8 = sdCRC7(this->expectedCRC,(U8)(uVar3 >> ((byte)local_58 & 0x3f)));
        this->expectedCRC = UVar8;
      }
      this->frameState = 5;
      this->frameCounter = 1;
      this->qwordLow = 0;
      this->startOfNextFrame = 0xffffffffffffffff;
    }
    break;
  case 4:
    puVar11 = std::min<unsigned_long_long>(&this->startOfNextFrame,&this->lastFallingClockEdge);
    this->startOfNextFrame = *puVar11;
    UVar4 = this->qwordLow;
    uVar9 = AnalyzerChannelData::GetBitState();
    this->qwordLow = UVar4 * 2 | (ulong)uVar9;
    this->frameCounter = this->frameCounter - 1;
    if (this->frameCounter == 0) {
      this->qwordLow = (ulong)((uint)this->qwordLow & 0x7f);
      UStack_38 = this->startOfNextFrame;
      _frame = AnalyzerChannelData::GetSampleOfNextEdge();
      uVar5 = this->qwordLow;
      uVar9 = this->expectedCRC;
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)pSVar13);
      if (uVar5 == uVar9) {
        pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                  operator->(&this->mResults);
        UVar4 = this->startOfNextFrame;
        std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::
        operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)pSVar13,(int)UVar4 + ErrorDot,(Channel *)0x6);
      }
      else {
        pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                  operator->(&this->mResults);
        UVar4 = this->startOfNextFrame;
        std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::
        operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)pSVar13,(int)UVar4 + ErrorDot,(Channel *)0x7);
      }
      pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
      FrameV2::AddByte((char *)pFVar12,0xb6);
      pFVar12 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator->(&this->frameV2);
      FrameV2::AddBoolean((char *)pFVar12,true);
      this->endingSampleInclusive = _frame;
      this->frameState = 5;
      this->qwordLow = 0;
    }
    break;
  case 5:
    pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
              operator->(&this->mResults);
    MVar10 = AnalyzerChannelData::GetSampleNumber();
    std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
              (&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)pSVar13,MVar10,(Channel *)0x9);
    if ((this->isCmd & 1U) == 0) {
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      pFVar14 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator*(&this->frameV2);
      AnalyzerResults::AddFrameV2
                ((FrameV2 *)pSVar13,(char *)pFVar14,0x112033,this->startingSampleInclusive);
    }
    else {
      pSVar13 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
                operator->(&this->mResults);
      pFVar14 = std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::operator*(&this->frameV2);
      AnalyzerResults::AddFrameV2
                ((FrameV2 *)pSVar13,(char *)pFVar14,0x11202b,this->startingSampleInclusive);
    }
    this_00 = (FrameV2 *)operator_new(8);
    FrameV2::FrameV2(this_00);
    std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::reset(&this->frameV2,this_00);
    this->frameState = 0;
    local_39 = true;
  }
  Frame::~Frame((Frame *)&stack0xffffffffffffffc8);
  return local_39;
}

Assistant:

bool SDIOAnalyzer::FrameStateMachine( void )
{
    Frame frame;
    bool done = false;
    U8 respLength;

    switch( frameState )
    {
    case TRANSMISSION_BIT:
        frame.mStartingSampleInclusive = lastFallingClockEdge;
        frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
        frame.mFlags = 0;
        frame.mData1 = mCmd->GetBitState();
        frame.mType = FRAME_DIR;
        mResults->AddFrame( frame );

        frameV2->AddBoolean( "DIR", frame.mData1 );
        startingSampleInclusive = frame.mStartingSampleInclusive;

        // The transmission bit tells us the origin of the packet
        // If the bit is high the packet comes from the host
        // If the bit is low, the packet comes from the slave
        isCmd = mCmd->GetBitState();

        mResults->AddMarker( lastFallingClockEdge, SDIOAnalyzerResults::MarkerType::Start, mSettings->mCmdChannel );
        if( isCmd )
        {
            mResults->AddMarker( mClock->GetSampleNumber(), SDIOAnalyzerResults::MarkerType::One, mSettings->mCmdChannel );
        }
        else
        {
            mResults->AddMarker( mClock->GetSampleNumber(), SDIOAnalyzerResults::MarkerType::Zero, mSettings->mCmdChannel );
        }

        frameState = COMMAND;
        frameCounter = 6;

        qwordLow = 0;
        lastCommand = 0;
        expectedCRC = 0;
        startOfNextFrame = UINT64_MAX;
        break;

    case COMMAND:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        qwordLow = ( qwordLow << 1 ) | mCmd->GetBitState();
        frameCounter--;

        if( frameCounter == 0 )
        {
            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = 0;
            frame.mData1 = qwordLow & 0x3F;
            frame.mData2 = isCmd ? 1 : 0;
            frame.mType = FRAME_CMD;

            mResults->AddFrame( frame );
            mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::Dot, mSettings->mCmdChannel );

            frameV2->AddByte( "CMD", frame.mData1 );
            frameV2->AddBoolean( "DIR", frame.mData2 );

            expectedCRC = sdCRC7( 0, ( frame.mData2 << 6 ) | frame.mData1 );

            // Once we have the argument

            lastCommand = frame.mData1;

            // Find the expected length of the next response based on the command
            if( !isCmd && ( qwordLow == 2 || qwordLow == 9 || qwordLow == 10 ) )
            // CMD2, CMD9 and CMD10 respond with long R2 response
            {
                respLength = 127;
                frameState = LONG_ARGUMENT;
            }
            else
            {
                // All others have 48 bit responses
                respLength = 32;
                frameState = NORMAL_ARGUMENT;
            }

            byte = 0;
            qwordLow = 0;
            byteCounter = 0;
            frameCounter = respLength;
            startOfNextFrame = UINT64_MAX;
        }
        break;

    case NORMAL_ARGUMENT:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        byte = byte << 1 | mCmd->GetBitState();
        qwordLow = ( qwordLow << 1 ) | mCmd->GetBitState();

        frameCounter--;

        if( ( frameCounter ) % 8 == 0 )
        {
            data[ byteCounter ] = byte;
            byteCounter++;
            byte = 0;
        }

        if( frameCounter == 0 )
        {
            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = lastCommand;
            frame.mData1 = qwordLow;
            frame.mType = FRAME_ARG;

            mResults->AddFrame( frame );
            mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::Square, mSettings->mCmdChannel );

            frameV2->AddByteArray( "ARG", data, 4 );

            for( signed int i = 24; i >= 0; i -= 8 )
                expectedCRC = sdCRC7( expectedCRC, 0xFF & ( frame.mData1 >> i ) );

            frameState = CRC7;
            frameCounter = 7;
            qwordLow = 0;
            startOfNextFrame = UINT64_MAX;
        }
        break;

    case LONG_ARGUMENT:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        byte = byte << 1 | mCmd->GetBitState();
        qwordLow = ( qwordLow << 1 ) | mCmd->GetBitState();

        frameCounter--;

        if( frameCounter % 8 == 0 )
        {
            data[ byteCounter ] = byte;
        }

        if( frameCounter == 63 )
        {
            qwordHigh = qwordLow;
            qwordLow = 0;
        }

        if( frameCounter == 0 )
        {
            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = lastCommand;
            frame.mData1 = qwordHigh;
            frame.mData2 = qwordLow;
            frame.mType = FRAME_LONG_ARG;
            mResults->AddFrame( frame );
            mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::Square, mSettings->mCmdChannel );

            frameV2->AddByteArray( "ARG", data, 8 );

            for( signed int i = 24; i >= 0; i -= 8 )
                expectedCRC = sdCRC7( expectedCRC, 0xFF & ( frame.mData1 >> i ) );

            for( signed int i = 24; i >= 0; i -= 8 )
                expectedCRC = sdCRC7( expectedCRC, 0xFF & ( frame.mData2 >> i ) );

            frameState = STOP;
            frameCounter = 1;
            qwordLow = 0;
            startOfNextFrame = UINT64_MAX;
        }
        break;

    case CRC7:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        qwordLow = qwordLow << 1 | mCmd->GetBitState();
        frameCounter--;

        if( frameCounter == 0 )
        {
            qwordLow &= 0x7F;

            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = 0;
            frame.mData1 = qwordLow;
            frame.mData2 = ( qwordLow == expectedCRC );
            frame.mType = FRAME_CRC;
            mResults->AddFrame( frame );

            if( frame.mData2 )
            {
                mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::X, mSettings->mCmdChannel );
            }
            else
            {
                mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::ErrorX, mSettings->mCmdChannel );
            }

            frameV2->AddByte( "CRC", frame.mData1 );
            frameV2->AddBoolean( "PASS", frame.mData2 );
            endingSampleInclusive = frame.mEndingSampleInclusive;

            frameState = STOP;
            qwordLow = 0;
        }
        break;

    case STOP:
        mResults->AddMarker( mClock->GetSampleNumber(), SDIOAnalyzerResults::MarkerType::Stop, mSettings->mCmdChannel );
        if( isCmd )
        {
            mResults->AddFrameV2( *frameV2, "CMD", startingSampleInclusive, endingSampleInclusive );
        }
        else
        {
            mResults->AddFrameV2( *frameV2, "RESP", startingSampleInclusive, endingSampleInclusive );
        }
        frameV2.reset( new FrameV2 );
        frameState = TRANSMISSION_BIT;
        done = true;

    default:
        break;
    }

    return done;
}